

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall StaticTaintAnalysisPass::initTaintSource(StaticTaintAnalysisPass *this,Module *M)

{
  Module *pMVar1;
  bool bVar2;
  Module *pMVar3;
  Module *pMVar4;
  Module *pMVar5;
  Module *pMVar6;
  Module *ins;
  Instruction *local_38;
  
  pMVar3 = *(Module **)(M + 0x20);
  if (pMVar3 != M + 0x18) {
    do {
      pMVar4 = pMVar3 + -0x38;
      if (pMVar3 == (Module *)0x0) {
        pMVar4 = (Module *)0x0;
      }
      for (pMVar1 = *(Module **)(pMVar4 + 0x50); pMVar1 != pMVar4 + 0x48;
          pMVar1 = *(Module **)(pMVar1 + 8)) {
        pMVar5 = pMVar1 + -0x18;
        if (pMVar1 == (Module *)0x0) {
          pMVar5 = (Module *)0x0;
        }
        for (pMVar6 = *(Module **)(pMVar5 + 0x30); pMVar6 != pMVar5 + 0x28;
            pMVar6 = *(Module **)(pMVar6 + 8)) {
          ins = pMVar6 + -0x18;
          if (pMVar6 == (Module *)0x0) {
            ins = (Module *)0x0;
          }
          bVar2 = isTaintSource(this,(Instruction *)ins);
          if (bVar2) {
            local_38 = (Instruction *)ins;
            std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                      ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)&this->taintSource,
                       (Value **)&local_38);
          }
        }
      }
      pMVar3 = *(Module **)(pMVar3 + 8);
    } while (pMVar3 != M + 0x18);
  }
  return;
}

Assistant:

void
StaticTaintAnalysisPass::initTaintSource(Module& M) {
    for ( auto pF = M.begin(); pF != M.end() ; ++ pF )  {
        for ( auto pB = pF->begin(); pB != pF->end(); ++pB ) {
            for ( auto pI = pB->begin(); pI != pB->end(); ++pI) {
                Instruction *pi = &(*pI) ;
                if ( isTaintSource(pi) ) {
                    taintSource.push_back(pi);
                }
            }       
        }
    }
}